

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_struct_print_method(t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  t_cpp_generator *this_00;
  
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  this_00 = (t_cpp_generator *)&stack0xffffffffffffffc0;
  std::__cxx11::string::~string((string *)this_00);
  generate_struct_print_method_decl(this_00,out,tstruct);
  poVar3 = std::operator<<(out," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"using ::apache::thrift::to_string;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"out << \"");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3,"(\";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  struct_ostream_operator_generator::generate_fields
            (out,&tstruct->members_,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  t_generator::indent_abi_cxx11_((string *)&stack0xffffffffffffffc0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&stack0xffffffffffffffc0);
  poVar3 = std::operator<<(poVar3,"out << \")\";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<(out,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_print_method(std::ostream& out, t_struct* tstruct) {
  out << indent();
  generate_struct_print_method_decl(out, tstruct);
  out << " {" << endl;

  indent_up();

  out << indent() << "using ::apache::thrift::to_string;" << endl;
  out << indent() << "out << \"" << tstruct->get_name() << "(\";" << endl;
  struct_ostream_operator_generator::generate_fields(out, tstruct->get_members(), indent());
  out << indent() << "out << \")\";" << endl;

  indent_down();
  out << "}" << endl << endl;
}